

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_diag_avx2_256_16.c
# Opt level: O1

parasail_result_t *
parasail_sg_flags_table_diag_avx2_256_16
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix,
          int s1_beg,int s1_end,int s2_beg,int s2_end)

{
  ulong uVar1;
  int16_t iVar2;
  ushort uVar3;
  int *piVar4;
  int *piVar5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  uint a;
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  int iVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  int iVar21;
  parasail_result_t *ppVar22;
  undefined1 (*ptr) [16];
  int16_t *ptr_00;
  int16_t *ptr_01;
  int16_t *ptr_02;
  long lVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  int iVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  int iVar34;
  uint uVar35;
  uint uVar36;
  uint uVar37;
  uint uVar38;
  uint uVar39;
  uint uVar40;
  uint uVar41;
  ulong uVar42;
  uint uVar43;
  ulong uVar44;
  ulong uVar45;
  undefined4 uVar46;
  ulong uVar47;
  ulong uVar48;
  ulong uVar49;
  ulong uVar50;
  uint uVar51;
  ulong uVar52;
  uint uVar53;
  ulong uVar54;
  ulong uVar55;
  ulong uVar56;
  ulong uVar57;
  short sVar58;
  ulong uVar59;
  int16_t iVar60;
  undefined2 uVar61;
  undefined1 auVar62 [64];
  short sVar63;
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [32];
  __m256i vMaxHCol;
  __m256i vMaxHRow;
  long local_440;
  long local_438;
  long local_430;
  long local_428;
  long local_420;
  long local_418;
  long local_410;
  long local_408;
  long local_400;
  long local_3f8;
  long local_3f0;
  long local_3e8;
  long local_3e0;
  long local_3d8;
  long local_3d0;
  long local_3c8;
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  short local_240;
  short sStack_23e;
  short sStack_23c;
  short sStack_23a;
  short sStack_238;
  short sStack_236;
  short sStack_234;
  short sStack_232;
  short sStack_230;
  short sStack_22e;
  short sStack_22c;
  short sStack_22a;
  short sStack_228;
  short sStack_226;
  short sStack_224;
  short sStack_222;
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined2 local_180;
  undefined2 uStack_17e;
  undefined2 uStack_17c;
  undefined2 uStack_17a;
  undefined2 uStack_178;
  undefined2 uStack_176;
  undefined2 uStack_174;
  undefined2 uStack_172;
  undefined2 uStack_170;
  undefined2 uStack_16e;
  undefined2 uStack_16c;
  undefined2 uStack_16a;
  undefined2 uStack_168;
  undefined2 uStack_166;
  undefined2 uStack_164;
  undefined2 uStack_162;
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined2 local_120;
  undefined2 uStack_11e;
  undefined2 uStack_11c;
  undefined2 uStack_11a;
  undefined2 uStack_118;
  undefined2 uStack_116;
  undefined2 uStack_114;
  undefined2 uStack_112;
  undefined2 uStack_110;
  undefined2 uStack_10e;
  undefined2 uStack_10c;
  undefined2 uStack_10a;
  undefined2 uStack_108;
  undefined2 uStack_106;
  undefined2 uStack_104;
  undefined2 uStack_102;
  undefined1 local_100 [32];
  short local_e0;
  short sStack_de;
  short sStack_dc;
  short sStack_da;
  short sStack_d8;
  short sStack_d6;
  short sStack_d4;
  short sStack_d2;
  short sStack_d0;
  short sStack_ce;
  short sStack_cc;
  short sStack_ca;
  short sStack_c8;
  short sStack_c6;
  short sStack_c4;
  short sStack_c2;
  undefined2 local_c0;
  undefined2 uStack_be;
  undefined2 uStack_bc;
  undefined2 uStack_ba;
  undefined2 uStack_b8;
  undefined2 uStack_b6;
  undefined2 uStack_b4;
  undefined2 uStack_b2;
  undefined2 uStack_b0;
  undefined2 uStack_ae;
  undefined2 uStack_ac;
  undefined2 uStack_aa;
  undefined2 uStack_a8;
  undefined2 uStack_a6;
  undefined2 uStack_a4;
  undefined2 uStack_a2;
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  if (_s2 == (char *)0x0) {
    parasail_sg_flags_table_diag_avx2_256_16_cold_7();
    return (parasail_result_t *)0x0;
  }
  uVar33 = (ulong)(uint)s2Len;
  if (s2Len < 1) {
    parasail_sg_flags_table_diag_avx2_256_16_cold_6();
    return (parasail_result_t *)0x0;
  }
  if (open < 0) {
    parasail_sg_flags_table_diag_avx2_256_16_cold_5();
    return (parasail_result_t *)0x0;
  }
  if (gap < 0) {
    parasail_sg_flags_table_diag_avx2_256_16_cold_4();
    return (parasail_result_t *)0x0;
  }
  if (matrix == (parasail_matrix_t *)0x0) {
    parasail_sg_flags_table_diag_avx2_256_16_cold_3();
    return (parasail_result_t *)0x0;
  }
  if (matrix->type == 0) {
    if (_s1 == (char *)0x0) {
      parasail_sg_flags_table_diag_avx2_256_16_cold_2();
      return (parasail_result_t *)0x0;
    }
    uVar52 = (ulong)(uint)_s1Len;
    if (_s1Len < 1) {
      parasail_sg_flags_table_diag_avx2_256_16_cold_1();
      return (parasail_result_t *)0x0;
    }
  }
  else {
    uVar52 = (ulong)(uint)matrix->length;
  }
  a = (uint)uVar52;
  iVar14 = a + 0xf;
  uVar53 = s2Len + 0xf;
  iVar34 = -open;
  iVar21 = matrix->min;
  iVar30 = -iVar21;
  if (iVar21 != iVar34 && SBORROW4(iVar21,iVar34) == iVar21 + open < 0) {
    iVar30 = open;
  }
  uVar28 = iVar30 - 0x7fff;
  sVar58 = 0x7ffe - (short)matrix->max;
  iVar60 = (int16_t)uVar28;
  local_280 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
  local_1a0 = local_280;
  if (s1_beg == 0) {
    local_1a0._0_2_ = (undefined2)(gap << 4);
    local_1a0._2_2_ = local_1a0._0_2_;
    local_1a0._4_2_ = local_1a0._0_2_;
    local_1a0._6_2_ = local_1a0._0_2_;
    local_1a0._8_2_ = local_1a0._0_2_;
    local_1a0._10_2_ = local_1a0._0_2_;
    local_1a0._12_2_ = local_1a0._0_2_;
    local_1a0._14_2_ = local_1a0._0_2_;
    local_1a0._16_2_ = local_1a0._0_2_;
    local_1a0._18_2_ = local_1a0._0_2_;
    local_1a0._20_2_ = local_1a0._0_2_;
    local_1a0._22_2_ = local_1a0._0_2_;
    local_1a0._24_2_ = local_1a0._0_2_;
    local_1a0._26_2_ = local_1a0._0_2_;
    local_1a0._28_2_ = local_1a0._0_2_;
    local_1a0._30_2_ = local_1a0._0_2_;
  }
  local_1c0._0_8_ = CONCAT26(iVar60,CONCAT24(iVar60,CONCAT22(iVar60,iVar60)));
  local_1c0._8_8_ = CONCAT26(iVar60,CONCAT24(iVar60,CONCAT22(iVar60,iVar60)));
  local_1c0._16_8_ = CONCAT26(iVar60,CONCAT24(iVar60,CONCAT22(iVar60,iVar60)));
  local_1c0._24_8_ = CONCAT26(iVar60,CONCAT24(iVar60,CONCAT22(iVar60,iVar60)));
  local_1e0._8_8_ = local_1c0._8_8_;
  local_1e0._0_8_ = local_1c0._0_8_;
  local_1e0._16_8_ = local_1c0._16_8_;
  local_1e0._24_8_ = local_1c0._24_8_;
  local_200._8_8_ = local_1c0._8_8_;
  local_200._0_8_ = local_1c0._0_8_;
  local_200._16_8_ = local_1c0._16_8_;
  local_200._24_8_ = local_1c0._24_8_;
  local_260._8_8_ = local_1c0._8_8_;
  local_260._0_8_ = local_1c0._0_8_;
  local_260._16_8_ = local_1c0._16_8_;
  local_260._24_8_ = local_1c0._24_8_;
  local_220._8_8_ = local_1c0._8_8_;
  local_220._0_8_ = local_1c0._0_8_;
  local_220._16_8_ = local_1c0._16_8_;
  local_220._24_8_ = local_1c0._24_8_;
  if (s1_beg == 0) {
    auVar71 = vpinsrw_avx(ZEXT416((uint)(gap * 0xfff9 - open)),gap * 0xfffa - open,1);
    auVar71 = vpinsrw_avx(auVar71,gap * 0xfffb - open,2);
    auVar71 = vpinsrw_avx(auVar71,iVar34 + gap * -4,3);
    auVar71 = vpinsrw_avx(auVar71,gap * 0xfffd - open,4);
    auVar71 = vpinsrw_avx(auVar71,iVar34 + gap * -2,5);
    auVar71 = vpinsrw_avx(auVar71,iVar34 - gap,6);
    auVar72 = vpinsrw_avx(ZEXT416((uint)(gap * 0xfff1 - open)),gap * 0xfff2 - open,1);
    auVar72 = vpinsrw_avx(auVar72,gap * 0xfff3 - open,2);
    auVar72 = vpinsrw_avx(auVar72,gap * 0xfff4 - open,3);
    auVar72 = vpinsrw_avx(auVar72,gap * 0xfff5 - open,4);
    auVar72 = vpinsrw_avx(auVar72,gap * 0xfff6 - open,5);
    auVar72 = vpinsrw_avx(auVar72,gap * 0xfff7 - open,6);
    auVar72 = vpinsrw_avx(auVar72,iVar34 + gap * -8,7);
    auVar71 = vpinsrw_avx(auVar71,iVar34,7);
    local_280._0_16_ = ZEXT116(0) * auVar71 + ZEXT116(1) * auVar72;
    local_280._16_16_ = ZEXT116(1) * auVar71;
  }
  ppVar22 = parasail_result_new_table1(a,s2Len);
  if (ppVar22 == (parasail_result_t *)0x0) {
    return (parasail_result_t *)0x0;
  }
  ppVar22->flag =
       (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe |
       (uint)(s2_end != 0) << 0xf | ppVar22->flag | 0x10221002;
  uVar24 = (ulong)(s2Len + 0x1e);
  ptr = (undefined1 (*) [16])parasail_memalign_int16_t(0x20,uVar24);
  ptr_00 = parasail_memalign_int16_t(0x20,uVar24);
  ptr_01 = parasail_memalign_int16_t(0x20,uVar24);
  if (ptr_01 == (int16_t *)0x0 || (ptr_00 == (int16_t *)0x0 || ptr == (undefined1 (*) [16])0x0)) {
    return (parasail_result_t *)0x0;
  }
  if (matrix->type == 0) {
    ptr_02 = parasail_memalign_int16_t(0x20,(long)iVar14);
    if (ptr_02 == (int16_t *)0x0) {
      return (parasail_result_t *)0x0;
    }
    if (0 < (int)a) {
      piVar4 = matrix->mapper;
      uVar24 = 0;
      do {
        ptr_02[uVar24] = (int16_t)piVar4[(byte)_s1[uVar24]];
        uVar24 = uVar24 + 1;
      } while (uVar52 != uVar24);
    }
    iVar21 = a + 1;
    if ((int)(a + 1) < iVar14) {
      iVar21 = iVar14;
    }
    memset(ptr_02 + (int)a,0,(ulong)(~a + iVar21) * 2 + 2);
  }
  else {
    ptr_02 = (int16_t *)0x0;
  }
  uVar61 = (undefined2)uVar52;
  local_80._2_2_ = uVar61;
  local_80._0_2_ = uVar61;
  local_80._4_2_ = uVar61;
  local_80._6_2_ = uVar61;
  local_80._8_2_ = uVar61;
  local_80._10_2_ = uVar61;
  local_80._12_2_ = uVar61;
  local_80._14_2_ = uVar61;
  local_80._16_2_ = uVar61;
  local_80._18_2_ = uVar61;
  local_80._20_2_ = uVar61;
  local_80._22_2_ = uVar61;
  local_80._24_2_ = uVar61;
  local_80._26_2_ = uVar61;
  local_80._28_2_ = uVar61;
  local_80._30_2_ = uVar61;
  auVar66 = vpcmpeqd_avx2(ZEXT432(a),ZEXT432(a));
  local_a0._0_2_ = (undefined2)s2Len;
  local_a0._2_2_ = local_a0._0_2_;
  local_a0._4_2_ = local_a0._0_2_;
  local_a0._6_2_ = local_a0._0_2_;
  local_a0._8_2_ = local_a0._0_2_;
  local_a0._10_2_ = local_a0._0_2_;
  local_a0._12_2_ = local_a0._0_2_;
  local_a0._14_2_ = local_a0._0_2_;
  local_a0._16_2_ = local_a0._0_2_;
  local_a0._18_2_ = local_a0._0_2_;
  local_a0._20_2_ = local_a0._0_2_;
  local_a0._22_2_ = local_a0._0_2_;
  local_a0._24_2_ = local_a0._0_2_;
  local_a0._26_2_ = local_a0._0_2_;
  local_a0._28_2_ = local_a0._0_2_;
  local_a0._30_2_ = local_a0._0_2_;
  local_c0 = (undefined2)open;
  sVar63 = (short)gap;
  local_140 = vpaddsw_avx2(local_80,auVar66);
  local_100 = vpaddsw_avx2(local_a0,auVar66);
  piVar4 = matrix->mapper;
  uVar24 = 1;
  if (1 < s2Len) {
    uVar24 = uVar33;
  }
  uVar31 = 0;
  do {
    *(short *)(ptr[1] + uVar31 * 2 + 0xe) = (short)piVar4[(byte)_s2[uVar31]];
    uVar31 = uVar31 + 1;
  } while (uVar24 != uVar31);
  *(undefined1 (*) [16])(*ptr + 0xe) = (undefined1  [16])0x0;
  *ptr = (undefined1  [16])0x0;
  uVar27 = s2Len + 1U;
  if ((int)(s2Len + 1U) < (int)uVar53) {
    uVar27 = uVar53;
  }
  local_240 = sVar58;
  sStack_23e = sVar58;
  sStack_23c = sVar58;
  sStack_23a = sVar58;
  sStack_238 = sVar58;
  sStack_236 = sVar58;
  sStack_234 = sVar58;
  sStack_232 = sVar58;
  sStack_230 = sVar58;
  sStack_22e = sVar58;
  sStack_22c = sVar58;
  sStack_22a = sVar58;
  sStack_228 = sVar58;
  sStack_226 = sVar58;
  sStack_224 = sVar58;
  sStack_222 = sVar58;
  local_e0 = sVar63;
  sStack_de = sVar63;
  sStack_dc = sVar63;
  sStack_da = sVar63;
  sStack_d8 = sVar63;
  sStack_d6 = sVar63;
  sStack_d4 = sVar63;
  sStack_d2 = sVar63;
  sStack_d0 = sVar63;
  sStack_ce = sVar63;
  sStack_cc = sVar63;
  sStack_ca = sVar63;
  sStack_c8 = sVar63;
  sStack_c6 = sVar63;
  sStack_c4 = sVar63;
  sStack_c2 = sVar63;
  uStack_be = local_c0;
  uStack_bc = local_c0;
  uStack_ba = local_c0;
  uStack_b8 = local_c0;
  uStack_b6 = local_c0;
  uStack_b4 = local_c0;
  uStack_b2 = local_c0;
  uStack_b0 = local_c0;
  uStack_ae = local_c0;
  uStack_ac = local_c0;
  uStack_aa = local_c0;
  uStack_a8 = local_c0;
  uStack_a6 = local_c0;
  uStack_a4 = local_c0;
  uStack_a2 = local_c0;
  memset(ptr[1] + uVar33 * 2 + 0xe,0,(ulong)(~s2Len + uVar27) * 2 + 2);
  uVar24 = 1;
  if (1 < s2Len) {
    uVar24 = uVar33;
  }
  uVar31 = 0;
  iVar21 = iVar34;
  if (s2_beg == 0) {
    do {
      ptr_00[uVar31 + 0xf] = (int16_t)iVar21;
      ptr_01[uVar31 + 0xf] = iVar60;
      uVar31 = uVar31 + 1;
      iVar21 = iVar21 - gap;
    } while (uVar24 != uVar31);
  }
  else {
    do {
      ptr_00[uVar31 + 0xf] = 0;
      ptr_01[uVar31 + 0xf] = iVar60;
      uVar31 = uVar31 + 1;
    } while (uVar24 != uVar31);
  }
  lVar23 = 0;
  do {
    ptr_00[lVar23] = iVar60;
    ptr_01[lVar23] = iVar60;
    lVar23 = lVar23 + 1;
  } while (lVar23 != 0xf);
  lVar23 = uVar33 + 0xf;
  uVar24 = uVar33;
  do {
    ptr_00[lVar23] = iVar60;
    ptr_01[lVar23] = iVar60;
    lVar23 = lVar23 + 1;
    uVar27 = (int)uVar24 + 1;
    uVar24 = (ulong)uVar27;
  } while ((int)uVar27 < (int)uVar53);
  ptr_00[0xe] = 0;
  auVar62 = ZEXT3264(local_200);
  auVar64 = ZEXT3264(local_260);
  auVar65 = ZEXT3264(local_220);
  if ((int)a < 1) {
    local_2a0._2_2_ = iVar60;
    local_2a0._0_2_ = iVar60;
    local_2a0._4_2_ = iVar60;
    local_2a0._6_2_ = iVar60;
    local_2a0._10_2_ = iVar60;
    local_2a0._8_2_ = iVar60;
    local_2a0._12_2_ = iVar60;
    local_2a0._14_2_ = iVar60;
    local_2a0._18_2_ = iVar60;
    local_2a0._16_2_ = iVar60;
    local_2a0._20_2_ = iVar60;
    local_2a0._22_2_ = iVar60;
    local_2a0._26_2_ = iVar60;
    local_2a0._24_2_ = iVar60;
    local_2a0._28_2_ = iVar60;
    local_2a0._30_2_ = iVar60;
    local_2c0._2_2_ = sStack_23e;
    local_2c0._0_2_ = local_240;
    local_2c0._4_2_ = sStack_23c;
    local_2c0._6_2_ = sStack_23a;
    local_2c0._10_2_ = sStack_236;
    local_2c0._8_2_ = sStack_238;
    local_2c0._12_2_ = sStack_234;
    local_2c0._14_2_ = sStack_232;
    local_2c0._18_2_ = sStack_22e;
    local_2c0._16_2_ = sStack_230;
    local_2c0._20_2_ = sStack_22c;
    local_2c0._22_2_ = sStack_22a;
    local_2c0._26_2_ = sStack_226;
    local_2c0._24_2_ = sStack_228;
    local_2c0._28_2_ = sStack_224;
    local_2c0._30_2_ = sStack_222;
  }
  else {
    local_2a0._2_2_ = iVar60;
    local_2a0._0_2_ = iVar60;
    local_2a0._4_2_ = iVar60;
    local_2a0._6_2_ = iVar60;
    local_2a0._8_2_ = iVar60;
    local_2a0._10_2_ = iVar60;
    local_2a0._12_2_ = iVar60;
    local_2a0._14_2_ = iVar60;
    local_2a0._16_2_ = iVar60;
    local_2a0._18_2_ = iVar60;
    local_2a0._20_2_ = iVar60;
    local_2a0._22_2_ = iVar60;
    local_2a0._24_2_ = iVar60;
    local_2a0._26_2_ = iVar60;
    local_2a0._28_2_ = iVar60;
    local_2a0._30_2_ = iVar60;
    local_160 = vpalignr_avx2(ZEXT1632(local_2a0._16_16_),local_2a0,2);
    uVar24 = 1;
    if (1 < (int)uVar53) {
      uVar24 = (ulong)uVar53;
    }
    lVar23 = uVar33 * 0x40;
    local_3d8 = uVar33 * 0x3c + -0x3c;
    local_3e0 = uVar33 * 0x38 + -0x38;
    local_3e8 = uVar33 * 0x34 + -0x34;
    local_3f0 = uVar33 * 0x18 + -0x18;
    local_3f8 = uVar33 * 0xc + -0xc;
    local_400 = uVar33 * 0x30 + -0x30;
    local_408 = uVar33 * 0x2c + -0x2c;
    local_410 = uVar33 * 0x24 + -0x24;
    local_418 = uVar33 * 0x20 + -0x20;
    local_420 = uVar33 * 0x1c + -0x1c;
    local_428 = uVar33 * 0x28 + -0x28;
    local_430 = uVar33 * 0x14 + -0x14;
    local_438 = uVar33 * 0x10 + -0x10;
    local_2e0._8_8_ = 0x80009000a000b;
    local_2e0._0_8_ = 0xc000d000e000f;
    local_2e0._16_8_ = 0x4000500060007;
    local_2e0._24_8_ = 0x100020003;
    local_120 = 1;
    uStack_11e = 1;
    uStack_11c = 1;
    uStack_11a = 1;
    uStack_118 = 1;
    uStack_116 = 1;
    uStack_114 = 1;
    uStack_112 = 1;
    uStack_110 = 1;
    uStack_10e = 1;
    uStack_10c = 1;
    uStack_10a = 1;
    uStack_108 = 1;
    uStack_106 = 1;
    uStack_104 = 1;
    uStack_102 = 1;
    local_180 = 0x10;
    uStack_17e = 0x10;
    uStack_17c = 0x10;
    uStack_17a = 0x10;
    uStack_178 = 0x10;
    uStack_176 = 0x10;
    uStack_174 = 0x10;
    uStack_172 = 0x10;
    uStack_170 = 0x10;
    uStack_16e = 0x10;
    uStack_16c = 0x10;
    uStack_16a = 0x10;
    uStack_168 = 0x10;
    uStack_166 = 0x10;
    uStack_164 = 0x10;
    uStack_162 = 0x10;
    local_2c0._2_2_ = sStack_23e;
    local_2c0._0_2_ = local_240;
    local_2c0._4_2_ = sStack_23c;
    local_2c0._6_2_ = sStack_23a;
    local_2c0._10_2_ = sStack_236;
    local_2c0._8_2_ = sStack_238;
    local_2c0._12_2_ = sStack_234;
    local_2c0._14_2_ = sStack_232;
    local_2c0._18_2_ = sStack_22e;
    local_2c0._16_2_ = sStack_230;
    local_2c0._20_2_ = sStack_22c;
    local_2c0._22_2_ = sStack_22a;
    local_2c0._26_2_ = sStack_226;
    local_2c0._24_2_ = sStack_228;
    local_2c0._28_2_ = sStack_224;
    local_2c0._30_2_ = sStack_222;
    piVar4 = matrix->matrix;
    uVar53 = a - 1;
    local_3c8 = uVar33 * 4 + -4;
    local_440 = uVar33 * 8 + -8;
    local_3d0 = 0;
    uVar31 = 0;
    do {
      iVar21 = matrix->type;
      uVar43 = (uint)uVar31;
      uVar27 = uVar43;
      if (iVar21 == 0) {
        uVar27 = (uint)ptr_02[uVar31];
      }
      uVar42 = uVar31 | 1;
      if (iVar21 == 0) {
        uVar15 = (int)ptr_02[uVar42];
      }
      else {
        uVar15 = uVar53;
        if (uVar42 < uVar52) {
          uVar15 = uVar43 | 1;
        }
      }
      uVar47 = uVar31 | 2;
      if (iVar21 == 0) {
        uVar16 = (int)ptr_02[uVar47];
      }
      else {
        uVar16 = uVar53;
        if (uVar47 < uVar52) {
          uVar16 = uVar43 | 2;
        }
      }
      uVar49 = uVar31 | 3;
      if (iVar21 == 0) {
        uVar17 = (int)ptr_02[uVar49];
      }
      else {
        uVar17 = uVar53;
        if (uVar49 < uVar52) {
          uVar17 = uVar43 | 3;
        }
      }
      uVar54 = uVar31 | 4;
      if (iVar21 == 0) {
        uVar18 = (int)ptr_02[uVar54];
      }
      else {
        uVar18 = uVar53;
        if (uVar54 < uVar52) {
          uVar18 = uVar43 | 4;
        }
      }
      uVar55 = uVar31 | 5;
      if (iVar21 == 0) {
        uVar19 = (int)ptr_02[uVar55];
      }
      else {
        uVar19 = uVar53;
        if (uVar55 < uVar52) {
          uVar19 = uVar43 | 5;
        }
      }
      uVar59 = uVar31 | 6;
      if (iVar21 == 0) {
        uVar20 = (int)ptr_02[uVar59];
      }
      else {
        uVar20 = uVar53;
        if (uVar59 < uVar52) {
          uVar20 = uVar43 | 6;
        }
      }
      iVar30 = matrix->size;
      uVar25 = uVar31 | 7;
      if (iVar21 == 0) {
        uVar35 = (int)ptr_02[uVar25];
      }
      else {
        uVar35 = uVar53;
        if (uVar25 < uVar52) {
          uVar35 = uVar43 | 7;
        }
      }
      uVar26 = uVar31 | 8;
      if (iVar21 == 0) {
        uVar36 = (int)ptr_02[uVar26];
      }
      else {
        uVar36 = uVar53;
        if (uVar26 < uVar52) {
          uVar36 = uVar43 | 8;
        }
      }
      uVar44 = uVar31 | 9;
      if (iVar21 == 0) {
        uVar37 = (int)ptr_02[uVar44];
      }
      else {
        uVar37 = uVar53;
        if (uVar44 < uVar52) {
          uVar37 = uVar43 | 9;
        }
      }
      uVar45 = uVar31 | 10;
      if (iVar21 == 0) {
        uVar38 = (int)ptr_02[uVar45];
      }
      else {
        uVar38 = uVar53;
        if (uVar45 < uVar52) {
          uVar38 = uVar43 | 10;
        }
      }
      uVar48 = uVar31 | 0xb;
      if (iVar21 == 0) {
        uVar39 = (int)ptr_02[uVar48];
      }
      else {
        uVar39 = uVar53;
        if (uVar48 < uVar52) {
          uVar39 = uVar43 | 0xb;
        }
      }
      uVar50 = uVar31 | 0xc;
      if (iVar21 == 0) {
        uVar40 = (int)ptr_02[uVar50];
      }
      else {
        uVar40 = uVar53;
        if (uVar50 < uVar52) {
          uVar40 = uVar43 | 0xc;
        }
      }
      uVar56 = uVar31 | 0xd;
      if (iVar21 == 0) {
        uVar41 = (int)ptr_02[uVar56];
      }
      else {
        uVar41 = uVar53;
        if (uVar56 < uVar52) {
          uVar41 = uVar43 | 0xd;
        }
      }
      uVar57 = uVar31 | 0xe;
      if (iVar21 == 0) {
        uVar29 = (int)ptr_02[uVar57];
      }
      else {
        uVar29 = uVar53;
        if (uVar57 < uVar52) {
          uVar29 = uVar43 | 0xe;
        }
      }
      uVar32 = uVar31 | 0xf;
      if (iVar21 == 0) {
        uVar51 = (int)ptr_02[uVar32];
      }
      else {
        uVar51 = uVar53;
        if (uVar32 < uVar52) {
          uVar51 = uVar43 | 0xf;
        }
      }
      uVar1 = uVar31 + 0x10;
      sVar58 = (short)iVar34 - (short)uVar31 * sVar63;
      iVar2 = ptr_00[0xe];
      auVar66._2_2_ = iVar2;
      auVar66._0_2_ = iVar2;
      auVar66._4_2_ = iVar2;
      auVar66._6_2_ = iVar2;
      auVar66._8_2_ = iVar2;
      auVar66._10_2_ = iVar2;
      auVar66._12_2_ = iVar2;
      auVar66._14_2_ = iVar2;
      auVar66._16_2_ = iVar2;
      auVar66._18_2_ = iVar2;
      auVar66._20_2_ = iVar2;
      auVar66._22_2_ = iVar2;
      auVar66._24_2_ = iVar2;
      auVar66._26_2_ = iVar2;
      auVar66._28_2_ = iVar2;
      auVar66._30_2_ = iVar2;
      ptr_00[0xe] = (short)iVar34 - (short)uVar1 * sVar63;
      if (s1_beg != 0) {
        sVar58 = 0;
      }
      auVar68._2_2_ = sVar58;
      auVar68._0_2_ = sVar58;
      auVar68._4_2_ = sVar58;
      auVar68._6_2_ = sVar58;
      auVar68._8_2_ = sVar58;
      auVar68._10_2_ = sVar58;
      auVar68._12_2_ = sVar58;
      auVar68._14_2_ = sVar58;
      auVar68._16_2_ = sVar58;
      auVar68._18_2_ = sVar58;
      auVar68._20_2_ = sVar58;
      auVar68._22_2_ = sVar58;
      auVar68._24_2_ = sVar58;
      auVar68._26_2_ = sVar58;
      auVar68._28_2_ = sVar58;
      auVar68._30_2_ = sVar58;
      auVar68 = vpblendw_avx2(local_160,auVar68,0x80);
      auVar68 = vpblendd_avx2(local_160,auVar68,0xf0);
      auVar66 = vpblendw_avx2(local_160,auVar66,0x80);
      auVar11 = vpblendd_avx2(local_160,auVar66,0xf0);
      auVar8 = vpcmpeqw_avx2(local_2e0,local_140);
      auVar10._2_2_ = iVar60;
      auVar10._0_2_ = iVar60;
      auVar10._4_2_ = iVar60;
      auVar10._6_2_ = iVar60;
      auVar10._8_2_ = iVar60;
      auVar10._10_2_ = iVar60;
      auVar10._12_2_ = iVar60;
      auVar10._14_2_ = iVar60;
      auVar10._16_2_ = iVar60;
      auVar10._18_2_ = iVar60;
      auVar10._20_2_ = iVar60;
      auVar10._22_2_ = iVar60;
      auVar10._24_2_ = iVar60;
      auVar10._26_2_ = iVar60;
      auVar10._28_2_ = iVar60;
      auVar10._30_2_ = iVar60;
      auVar66 = vpmovsxbw_avx2(_DAT_008d4a94);
      uVar31 = 0;
      auVar6 = auVar10;
      do {
        auVar71 = vpinsrw_avx(ZEXT416((uint)piVar4[(long)(int)(uVar35 * iVar30) +
                                                   (long)*(short *)(ptr[1] + uVar31 * 2)]),
                              (uint)*(ushort *)
                                     (piVar4 + (long)(int)(uVar20 * iVar30) +
                                               (long)*(short *)(ptr[1] + uVar31 * 2 + 2)),1);
        auVar71 = vpinsrw_avx(auVar71,(uint)*(ushort *)
                                             (piVar4 + (long)(int)(uVar19 * iVar30) +
                                                       (long)*(short *)(ptr[1] + uVar31 * 2 + 4)),2)
        ;
        auVar71 = vpinsrw_avx(auVar71,(uint)*(ushort *)
                                             (piVar4 + (long)(int)(uVar18 * iVar30) +
                                                       (long)*(short *)(ptr[1] + uVar31 * 2 + 6)),3)
        ;
        auVar71 = vpinsrw_avx(auVar71,(uint)*(ushort *)
                                             (piVar4 + (long)(int)(uVar17 * iVar30) +
                                                       (long)*(short *)(ptr[1] + uVar31 * 2 + 8)),4)
        ;
        auVar71 = vpinsrw_avx(auVar71,(uint)*(ushort *)
                                             (piVar4 + (long)(int)(uVar16 * iVar30) +
                                                       (long)*(short *)(ptr[1] + uVar31 * 2 + 10)),5
                             );
        auVar71 = vpinsrw_avx(auVar71,(uint)*(ushort *)
                                             (piVar4 + (long)(int)(uVar15 * iVar30) +
                                                       (long)*(short *)(ptr[1] + uVar31 * 2 + 0xc)),
                              6);
        auVar71 = vpinsrw_avx(auVar71,(uint)*(ushort *)
                                             (piVar4 + (long)(int)(uVar27 * iVar30) +
                                                       (long)*(short *)(ptr[1] + uVar31 * 2 + 0xe)),
                              7);
        auVar72 = vpinsrw_avx(ZEXT416((uint)piVar4[(long)(int)(uVar51 * iVar30) +
                                                   (long)*(short *)(*ptr + uVar31 * 2)]),
                              (uint)*(ushort *)
                                     (piVar4 + (long)(int)(uVar29 * iVar30) +
                                               (long)*(short *)(*ptr + uVar31 * 2 + 2)),1);
        auVar72 = vpinsrw_avx(auVar72,(uint)*(ushort *)
                                             (piVar4 + (long)(int)(uVar41 * iVar30) +
                                                       (long)*(short *)(*ptr + uVar31 * 2 + 4)),2);
        auVar72 = vpinsrw_avx(auVar72,(uint)*(ushort *)
                                             (piVar4 + (long)(int)(uVar40 * iVar30) +
                                                       (long)*(short *)(*ptr + uVar31 * 2 + 6)),3);
        auVar72 = vpinsrw_avx(auVar72,(uint)*(ushort *)
                                             (piVar4 + (long)(int)(uVar39 * iVar30) +
                                                       (long)*(short *)(*ptr + uVar31 * 2 + 8)),4);
        auVar72 = vpinsrw_avx(auVar72,(uint)*(ushort *)
                                             (piVar4 + (long)(int)(uVar38 * iVar30) +
                                                       (long)*(short *)(*ptr + uVar31 * 2 + 10)),5);
        auVar72 = vpinsrw_avx(auVar72,(uint)*(ushort *)
                                             (piVar4 + (long)(int)(uVar37 * iVar30) +
                                                       (long)*(short *)(*ptr + uVar31 * 2 + 0xc)),6)
        ;
        auVar72 = vpinsrw_avx(auVar72,(uint)*(ushort *)
                                             (piVar4 + (long)(int)(uVar36 * iVar30) +
                                                       (long)*(short *)(*ptr + uVar31 * 2 + 0xe)),7)
        ;
        iVar2 = ptr_00[uVar31 + 0xf];
        auVar73._2_2_ = iVar2;
        auVar73._0_2_ = iVar2;
        auVar73._4_2_ = iVar2;
        auVar73._6_2_ = iVar2;
        auVar73._8_2_ = iVar2;
        auVar73._10_2_ = iVar2;
        auVar73._12_2_ = iVar2;
        auVar73._14_2_ = iVar2;
        auVar73._16_2_ = iVar2;
        auVar73._18_2_ = iVar2;
        auVar73._20_2_ = iVar2;
        auVar73._22_2_ = iVar2;
        auVar73._24_2_ = iVar2;
        auVar73._26_2_ = iVar2;
        auVar73._28_2_ = iVar2;
        auVar73._30_2_ = iVar2;
        auVar69._0_16_ = ZEXT116(0) * auVar71 + ZEXT116(1) * auVar72;
        auVar69._16_16_ = ZEXT116(1) * auVar71;
        auVar70 = vpalignr_avx2(ZEXT1632(auVar68._16_16_),auVar68,2);
        auVar7 = vpblendw_avx2(auVar70,auVar73,0x80);
        auVar69 = vpaddsw_avx2(auVar11,auVar69);
        auVar11 = vpblendd_avx2(auVar70,auVar7,0xf0);
        iVar2 = ptr_01[uVar31 + 0xf];
        auVar70._2_2_ = iVar2;
        auVar70._0_2_ = iVar2;
        auVar70._4_2_ = iVar2;
        auVar70._6_2_ = iVar2;
        auVar70._8_2_ = iVar2;
        auVar70._10_2_ = iVar2;
        auVar70._12_2_ = iVar2;
        auVar70._14_2_ = iVar2;
        auVar70._16_2_ = iVar2;
        auVar70._18_2_ = iVar2;
        auVar70._20_2_ = iVar2;
        auVar70._22_2_ = iVar2;
        auVar70._24_2_ = iVar2;
        auVar70._26_2_ = iVar2;
        auVar70._28_2_ = iVar2;
        auVar70._30_2_ = iVar2;
        auVar6 = vpalignr_avx2(ZEXT1632(auVar6._16_16_),auVar6,2);
        auVar70 = vpblendw_avx2(auVar6,auVar70,0x80);
        auVar70 = vpblendd_avx2(auVar6,auVar70,0xf0);
        auVar9._2_2_ = uStack_be;
        auVar9._0_2_ = local_c0;
        auVar9._4_2_ = uStack_bc;
        auVar9._6_2_ = uStack_ba;
        auVar9._8_2_ = uStack_b8;
        auVar9._10_2_ = uStack_b6;
        auVar9._12_2_ = uStack_b4;
        auVar9._14_2_ = uStack_b2;
        auVar9._16_2_ = uStack_b0;
        auVar9._18_2_ = uStack_ae;
        auVar9._20_2_ = uStack_ac;
        auVar9._22_2_ = uStack_aa;
        auVar9._24_2_ = uStack_a8;
        auVar9._26_2_ = uStack_a6;
        auVar9._28_2_ = uStack_a4;
        auVar9._30_2_ = uStack_a2;
        auVar6 = vpsubsw_avx2(auVar11,auVar9);
        auVar7._2_2_ = sStack_de;
        auVar7._0_2_ = local_e0;
        auVar7._4_2_ = sStack_dc;
        auVar7._6_2_ = sStack_da;
        auVar7._8_2_ = sStack_d8;
        auVar7._10_2_ = sStack_d6;
        auVar7._12_2_ = sStack_d4;
        auVar7._14_2_ = sStack_d2;
        auVar7._16_2_ = sStack_d0;
        auVar7._18_2_ = sStack_ce;
        auVar7._20_2_ = sStack_cc;
        auVar7._22_2_ = sStack_ca;
        auVar7._24_2_ = sStack_c8;
        auVar7._26_2_ = sStack_c6;
        auVar7._28_2_ = sStack_c4;
        auVar7._30_2_ = sStack_c2;
        auVar70 = vpsubsw_avx2(auVar70,auVar7);
        auVar6 = vpmaxsw_avx2(auVar6,auVar70);
        auVar68 = vpsubsw_avx2(auVar68,auVar9);
        auVar10 = vpsubsw_avx2(auVar10,auVar7);
        auVar70 = vpmaxsw_avx2(auVar68,auVar10);
        auVar68 = vpmaxsw_avx2(auVar70,auVar6);
        auVar69 = vpmaxsw_avx2(auVar69,auVar68);
        auVar10 = vpcmpeqw_avx2(auVar66,_DAT_008d4ac0);
        auVar68 = vpblendvb_avx2(auVar69,local_280,auVar10);
        if (0xf < uVar31) {
          local_2c0 = vpminsw_avx2(auVar68,local_2c0);
          local_2a0 = vpmaxsw_avx2(auVar68,local_2a0);
        }
        piVar5 = ((ppVar22->field_4).rowcols)->score_row;
        auVar71 = auVar68._0_16_;
        auVar72 = auVar68._16_16_;
        if (uVar31 < uVar33) {
          uVar46 = vpextrw_avx(auVar72,7);
          *(int *)((long)piVar5 + uVar31 * 4 + local_3d0) = (int)(short)uVar46;
        }
        if (uVar31 - 1 < uVar33 && uVar42 < uVar52) {
          uVar46 = vpextrw_avx(auVar72,6);
          *(int *)((long)piVar5 + uVar31 * 4 + local_3c8) = (int)(short)uVar46;
        }
        if ((uVar47 < uVar52) && ((long)(uVar31 - 2) < (long)uVar33 && 1 < uVar31)) {
          uVar46 = vpextrw_avx(auVar72,5);
          *(int *)((long)piVar5 + uVar31 * 4 + local_440) = (int)(short)uVar46;
        }
        if ((uVar49 < uVar52) && ((long)(uVar31 - 3) < (long)uVar33 && 2 < uVar31)) {
          uVar46 = vpextrw_avx(auVar72,4);
          *(int *)((long)piVar5 + uVar31 * 4 + local_3f8) = (int)(short)uVar46;
        }
        if ((uVar54 < uVar52) && ((long)(uVar31 - 4) < (long)uVar33 && 3 < uVar31)) {
          uVar46 = vpextrw_avx(auVar72,3);
          *(int *)((long)piVar5 + uVar31 * 4 + local_438) = (int)(short)uVar46;
        }
        if ((uVar55 < uVar52) && ((long)(uVar31 - 5) < (long)uVar33 && 4 < uVar31)) {
          uVar46 = vpextrw_avx(auVar72,2);
          *(int *)((long)piVar5 + uVar31 * 4 + local_430) = (int)(short)uVar46;
        }
        if ((uVar59 < uVar52) && ((long)(uVar31 - 6) < (long)uVar33 && 5 < uVar31)) {
          uVar46 = vpextrw_avx(auVar72,1);
          *(int *)((long)piVar5 + uVar31 * 4 + local_3f0) = (int)(short)uVar46;
        }
        if ((uVar25 < uVar52) && ((long)(uVar31 - 7) < (long)uVar33 && 6 < uVar31)) {
          *(int *)((long)piVar5 + uVar31 * 4 + local_420) = (int)auVar68._16_2_;
        }
        if ((uVar26 < uVar52) && ((long)(uVar31 - 8) < (long)uVar33 && 7 < uVar31)) {
          uVar46 = vpextrw_avx(auVar71,7);
          *(int *)((long)piVar5 + uVar31 * 4 + local_418) = (int)(short)uVar46;
        }
        if ((uVar44 < uVar52) && ((long)(uVar31 - 9) < (long)uVar33 && 8 < uVar31)) {
          uVar46 = vpextrw_avx(auVar71,6);
          *(int *)((long)piVar5 + uVar31 * 4 + local_410) = (int)(short)uVar46;
        }
        if ((uVar45 < uVar52) && ((long)(uVar31 - 10) < (long)uVar33 && 9 < uVar31)) {
          uVar46 = vpextrw_avx(auVar71,5);
          *(int *)((long)piVar5 + uVar31 * 4 + local_428) = (int)(short)uVar46;
        }
        if ((uVar48 < uVar52) && ((long)(uVar31 - 0xb) < (long)uVar33 && 10 < uVar31)) {
          uVar46 = vpextrw_avx(auVar71,4);
          *(int *)((long)piVar5 + uVar31 * 4 + local_408) = (int)(short)uVar46;
        }
        if ((uVar50 < uVar52) && ((long)(uVar31 - 0xc) < (long)uVar33 && 0xb < uVar31)) {
          uVar46 = vpextrw_avx(auVar71,3);
          *(int *)((long)piVar5 + uVar31 * 4 + local_400) = (int)(short)uVar46;
        }
        if ((uVar56 < uVar52) && ((long)(uVar31 - 0xd) < (long)uVar33 && 0xc < uVar31)) {
          uVar46 = vpextrw_avx(auVar71,2);
          *(int *)((long)piVar5 + uVar31 * 4 + local_3e8) = (int)(short)uVar46;
        }
        if ((uVar57 < uVar52) && ((long)(uVar31 - 0xe) < (long)uVar33 && 0xd < uVar31)) {
          uVar46 = vpextrw_avx(auVar71,1);
          *(int *)((long)piVar5 + uVar31 * 4 + local_3e0) = (int)(short)uVar46;
        }
        auVar67._2_2_ = iVar60;
        auVar67._0_2_ = iVar60;
        auVar67._4_2_ = iVar60;
        auVar67._6_2_ = iVar60;
        auVar67._8_2_ = iVar60;
        auVar67._10_2_ = iVar60;
        auVar67._12_2_ = iVar60;
        auVar67._14_2_ = iVar60;
        auVar67._16_2_ = iVar60;
        auVar67._18_2_ = iVar60;
        auVar67._20_2_ = iVar60;
        auVar67._22_2_ = iVar60;
        auVar67._24_2_ = iVar60;
        auVar67._26_2_ = iVar60;
        auVar67._28_2_ = iVar60;
        auVar67._30_2_ = iVar60;
        auVar6 = vpblendvb_avx2(auVar6,auVar67,auVar10);
        if ((uVar32 < uVar52) && ((long)(uVar31 - 0xf) < (long)uVar33 && 0xe < uVar31)) {
          *(int *)((long)piVar5 + uVar31 * 4 + local_3d8) = (int)auVar68._0_2_;
        }
        auVar12._2_2_ = iVar60;
        auVar12._0_2_ = iVar60;
        auVar12._4_2_ = iVar60;
        auVar12._6_2_ = iVar60;
        auVar12._8_2_ = iVar60;
        auVar12._10_2_ = iVar60;
        auVar12._12_2_ = iVar60;
        auVar12._14_2_ = iVar60;
        auVar12._16_2_ = iVar60;
        auVar12._18_2_ = iVar60;
        auVar12._20_2_ = iVar60;
        auVar12._22_2_ = iVar60;
        auVar12._24_2_ = iVar60;
        auVar12._26_2_ = iVar60;
        auVar12._28_2_ = iVar60;
        auVar12._30_2_ = iVar60;
        auVar10 = vpblendvb_avx2(auVar70,auVar12,auVar10);
        vpextrw_avx(auVar71,0);
        auVar7 = vpcmpgtw_avx2(local_80,local_2e0);
        vpextrw_avx(auVar6._0_16_,0);
        auVar9 = vpcmpeqw_avx2(auVar66,local_100);
        auVar70 = vpcmpgtw_avx2(local_a0,auVar66);
        auVar73 = vpcmpgtw_avx2(auVar68,local_1c0);
        auVar67 = vpsraw_avx2(auVar66,0xf);
        auVar70 = vpandn_avx2(auVar67,auVar70);
        auVar70 = vpand_avx2(auVar70,auVar8);
        auVar70 = vpand_avx2(auVar73,auVar70);
        auVar73 = vpcmpgtw_avx2(auVar68,local_1e0);
        auVar7 = vpand_avx2(auVar7,auVar9);
        auVar7 = vpand_avx2(auVar7,auVar73);
        local_1c0 = vpblendvb_avx2(local_1c0,auVar69,auVar70);
        local_1e0 = vpblendvb_avx2(local_1e0,auVar68,auVar7);
        auVar69 = vpand_avx2(auVar9,auVar8);
        local_200 = vpblendvb_avx2(auVar62._0_32_,auVar68,auVar69);
        auVar62 = ZEXT3264(local_200);
        local_260 = vpblendvb_avx2(auVar64._0_32_,local_2e0,auVar7);
        auVar64 = ZEXT3264(local_260);
        local_220 = vpblendvb_avx2(auVar65._0_32_,auVar66,auVar70);
        auVar65 = ZEXT3264(local_220);
        auVar13._8_2_ = 1;
        auVar13._0_8_ = 0x1000100010001;
        auVar13._10_2_ = 1;
        auVar13._12_2_ = 1;
        auVar13._14_2_ = 1;
        auVar13._16_2_ = 1;
        auVar13._18_2_ = 1;
        auVar13._20_2_ = 1;
        auVar13._22_2_ = 1;
        auVar13._24_2_ = 1;
        auVar13._26_2_ = 1;
        auVar13._28_2_ = 1;
        auVar13._30_2_ = 1;
        auVar66 = vpaddsw_avx2(auVar66,auVar13);
        uVar31 = uVar31 + 1;
      } while (uVar24 != uVar31);
      auVar6._8_2_ = 0x10;
      auVar6._0_8_ = 0x10001000100010;
      auVar6._10_2_ = 0x10;
      auVar6._12_2_ = 0x10;
      auVar6._14_2_ = 0x10;
      auVar6._16_2_ = 0x10;
      auVar6._18_2_ = 0x10;
      auVar6._20_2_ = 0x10;
      auVar6._22_2_ = 0x10;
      auVar6._24_2_ = 0x10;
      auVar6._26_2_ = 0x10;
      auVar6._28_2_ = 0x10;
      auVar6._30_2_ = 0x10;
      local_2e0 = vpaddsw_avx2(local_2e0,auVar6);
      local_280 = vpsubsw_avx2(local_280,local_1a0);
      local_3d0 = local_3d0 + lVar23;
      local_3c8 = local_3c8 + lVar23;
      local_3d8 = local_3d8 + lVar23;
      local_3e0 = local_3e0 + lVar23;
      local_3e8 = local_3e8 + lVar23;
      local_400 = local_400 + lVar23;
      local_408 = local_408 + lVar23;
      local_428 = local_428 + lVar23;
      local_410 = local_410 + lVar23;
      local_418 = local_418 + lVar23;
      local_420 = local_420 + lVar23;
      local_3f0 = local_3f0 + lVar23;
      local_430 = local_430 + lVar23;
      local_438 = local_438 + lVar23;
      local_3f8 = local_3f8 + lVar23;
      local_440 = local_440 + lVar23;
      uVar31 = uVar1;
    } while (uVar1 < uVar52);
  }
  lVar23 = 0;
  iVar30 = 0;
  iVar21 = 0;
  uVar53 = uVar28;
  uVar27 = uVar28;
  do {
    uVar3 = *(ushort *)(local_1e0 + lVar23 * 2);
    if (((short)(ushort)uVar53 < (short)uVar3) ||
       ((uVar3 == (ushort)uVar53 && (*(short *)(local_260 + lVar23 * 2) < iVar30)))) {
      iVar30 = (int)*(short *)(local_260 + lVar23 * 2);
      uVar53 = (uint)uVar3;
    }
    sVar58 = (short)uVar53;
    if ((short)uVar27 < (short)*(ushort *)(local_1c0 + lVar23 * 2)) {
      iVar21 = (int)*(short *)(local_220 + lVar23 * 2);
      uVar27 = (uint)*(ushort *)(local_1c0 + lVar23 * 2);
    }
    sVar63 = (short)uVar27;
    uVar43 = (uint)*(ushort *)(local_200 + lVar23 * 2);
    if ((short)*(ushort *)(local_200 + lVar23 * 2) <= (short)uVar28) {
      uVar43 = uVar28;
    }
    uVar28 = uVar43;
    lVar23 = lVar23 + 1;
  } while ((int)lVar23 != 0x10);
  if (s1_end == 0 || s2_end == 0) {
    if (s1_end == 0) {
      iVar30 = a - 1;
      iVar14 = s2Len + -1;
      sVar58 = (short)uVar28;
      if (s2_end != 0) {
        iVar14 = iVar21;
        sVar58 = sVar63;
      }
      goto LAB_0078be19;
    }
  }
  else if ((sVar58 <= sVar63) && ((sVar58 != sVar63 || (iVar21 != s2Len + -1)))) {
    iVar30 = a - 1;
    iVar14 = iVar21;
    sVar58 = sVar63;
    goto LAB_0078be19;
  }
  iVar14 = s2Len + -1;
LAB_0078be19:
  auVar8._2_2_ = iVar60;
  auVar8._0_2_ = iVar60;
  auVar8._4_2_ = iVar60;
  auVar8._6_2_ = iVar60;
  auVar8._8_2_ = iVar60;
  auVar8._10_2_ = iVar60;
  auVar8._12_2_ = iVar60;
  auVar8._14_2_ = iVar60;
  auVar8._16_2_ = iVar60;
  auVar8._18_2_ = iVar60;
  auVar8._20_2_ = iVar60;
  auVar8._22_2_ = iVar60;
  auVar8._24_2_ = iVar60;
  auVar8._26_2_ = iVar60;
  auVar8._28_2_ = iVar60;
  auVar8._30_2_ = iVar60;
  auVar66 = vpcmpgtw_avx2(auVar8,local_2c0);
  auVar11._2_2_ = sStack_23e;
  auVar11._0_2_ = local_240;
  auVar11._4_2_ = sStack_23c;
  auVar11._6_2_ = sStack_23a;
  auVar11._8_2_ = sStack_238;
  auVar11._10_2_ = sStack_236;
  auVar11._12_2_ = sStack_234;
  auVar11._14_2_ = sStack_232;
  auVar11._16_2_ = sStack_230;
  auVar11._18_2_ = sStack_22e;
  auVar11._20_2_ = sStack_22c;
  auVar11._22_2_ = sStack_22a;
  auVar11._24_2_ = sStack_228;
  auVar11._26_2_ = sStack_226;
  auVar11._28_2_ = sStack_224;
  auVar11._30_2_ = sStack_222;
  auVar68 = vpcmpgtw_avx2(local_2a0,auVar11);
  auVar66 = vpor_avx2(auVar66,auVar68);
  if ((((((((((((((((((((((((((((((((auVar66 >> 7 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                   || (auVar66 >> 0xf & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                                  (auVar66 >> 0x17 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                  ) || (auVar66 >> 0x1f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                (auVar66 >> 0x27 & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || (auVar66 >> 0x2f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar66 >> 0x37 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                             (auVar66 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar66 >> 0x47 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           (auVar66 >> 0x4f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar66 >> 0x57 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar66 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar66 >> 0x67 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar66 >> 0x6f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar66 >> 0x77 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar66 >> 0x7f,0) != '\0') ||
                    (auVar66 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   (auVar66 >> 0x8f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar66 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 (auVar66 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar66 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               (auVar66 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar66 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar66 >> 0xbf,0) != '\0') ||
            (auVar66 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           (auVar66 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar66 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         (auVar66 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
        (auVar66 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
       (auVar66 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
      (auVar66 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) || auVar66[0x1f] < '\0') {
    *(byte *)&ppVar22->flag = (byte)ppVar22->flag | 0x40;
    sVar58 = 0;
    iVar14 = 0;
    iVar30 = 0;
  }
  ppVar22->score = (int)sVar58;
  ppVar22->end_query = iVar30;
  ppVar22->end_ref = iVar14;
  parasail_free(ptr_01);
  parasail_free(ptr_00);
  parasail_free(ptr);
  if (matrix->type == 0) {
    parasail_free(ptr_02);
    return ppVar22;
  }
  return ppVar22;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int16_t * restrict s1 = NULL;
    int16_t * restrict s2B = NULL;
    int16_t * restrict _H_pr = NULL;
    int16_t * restrict _F_pr = NULL;
    int16_t * restrict s2 = NULL;
    int16_t * restrict H_pr = NULL;
    int16_t * restrict F_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    int16_t score = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vNegInf;
    __m256i vOpen;
    __m256i vGap;
    __m256i vOne;
    __m256i vN;
    __m256i vGapN;
    __m256i vNegOne;
    __m256i vI;
    __m256i vJreset;
    __m256i vMaxHRow;
    __m256i vMaxHCol;
    __m256i vLastVal;
    __m256i vEndI;
    __m256i vEndJ;
    __m256i vILimit;
    __m256i vILimit1;
    __m256i vJLimit;
    __m256i vJLimit1;
    __m256i vIBoundary;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 16; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm256_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm256_set1_epi16(NEG_LIMIT);
    vOpen = _mm256_set1_epi16(open);
    vGap  = _mm256_set1_epi16(gap);
    vOne = _mm256_set1_epi16(1);
    vN = _mm256_set1_epi16(N);
    vGapN = s1_beg ? _mm256_set1_epi16(0) : _mm256_set1_epi16(gap*N);
    vNegOne = _mm256_set1_epi16(-1);
    vI = _mm256_set_epi16(0,1,2,3,4,5,6,7,8,9,10,11,12,13,14,15);
    vJreset = _mm256_set_epi16(0,-1,-2,-3,-4,-5,-6,-7,-8,-9,-10,-11,-12,-13,-14,-15);
    vMaxHRow = vNegInf;
    vMaxHCol = vNegInf;
    vLastVal = vNegInf;
    vEndI = vNegInf;
    vEndJ = vNegInf;
    vILimit = _mm256_set1_epi16(s1Len);
    vILimit1 = _mm256_subs_epi16(vILimit, vOne);
    vJLimit = _mm256_set1_epi16(s2Len);
    vJLimit1 = _mm256_subs_epi16(vJLimit, vOne);
    vIBoundary = s1_beg ? _mm256_set1_epi16(0) : _mm256_set_epi16(
            -open-0*gap,
            -open-1*gap,
            -open-2*gap,
            -open-3*gap,
            -open-4*gap,
            -open-5*gap,
            -open-6*gap,
            -open-7*gap,
            -open-8*gap,
            -open-9*gap,
            -open-10*gap,
            -open-11*gap,
            -open-12*gap,
            -open-13*gap,
            -open-14*gap,
            -open-15*gap);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_16;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2B= parasail_memalign_int16_t(32, s2Len+PAD2);
    _H_pr = parasail_memalign_int16_t(32, s2Len+PAD2);
    _F_pr = parasail_memalign_int16_t(32, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    F_pr = _F_pr+PAD;

    /* validate heap variables */
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_F_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int16_t(32, s1Len+PAD);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
        /* pad back of s1 with dummy values */
        for (i=s1Len; i<s1Len_PAD; ++i) {
            s1[i] = 0; /* point to first matrix row because we don't care */
        }
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    if (s2_beg) {
        for (j=0; j<s2Len; ++j) {
            H_pr[j] = 0;
            F_pr[j] = NEG_LIMIT;
        }
    }
    else {
        for (j=0; j<s2Len; ++j) {
            H_pr[j] = -open - j*gap;
            F_pr[j] = NEG_LIMIT;
        }
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    H_pr[-1] = 0; /* upper left corner */

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m256i vNH = vNegInf;
        __m256i vWH = vNegInf;
        __m256i vE = vNegInf;
        __m256i vF = vNegInf;
        __m256i vJ = vJreset;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        const int * const restrict matrow2 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+2] : ((i+2 >= s1Len) ? s1Len-1 : i+2))];
        const int * const restrict matrow3 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+3] : ((i+3 >= s1Len) ? s1Len-1 : i+3))];
        const int * const restrict matrow4 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+4] : ((i+4 >= s1Len) ? s1Len-1 : i+4))];
        const int * const restrict matrow5 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+5] : ((i+5 >= s1Len) ? s1Len-1 : i+5))];
        const int * const restrict matrow6 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+6] : ((i+6 >= s1Len) ? s1Len-1 : i+6))];
        const int * const restrict matrow7 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+7] : ((i+7 >= s1Len) ? s1Len-1 : i+7))];
        const int * const restrict matrow8 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+8] : ((i+8 >= s1Len) ? s1Len-1 : i+8))];
        const int * const restrict matrow9 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+9] : ((i+9 >= s1Len) ? s1Len-1 : i+9))];
        const int * const restrict matrow10 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+10] : ((i+10 >= s1Len) ? s1Len-1 : i+10))];
        const int * const restrict matrow11 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+11] : ((i+11 >= s1Len) ? s1Len-1 : i+11))];
        const int * const restrict matrow12 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+12] : ((i+12 >= s1Len) ? s1Len-1 : i+12))];
        const int * const restrict matrow13 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+13] : ((i+13 >= s1Len) ? s1Len-1 : i+13))];
        const int * const restrict matrow14 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+14] : ((i+14 >= s1Len) ? s1Len-1 : i+14))];
        const int * const restrict matrow15 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+15] : ((i+15 >= s1Len) ? s1Len-1 : i+15))];
        __m256i vIltLimit = _mm256_cmplt_epi16_rpl(vI, vILimit);
        __m256i vIeqLimit1 = _mm256_cmpeq_epi16(vI, vILimit1);
        vNH = _mm256_srli_si256_rpl(vNH, 2);
        vNH = _mm256_insert_epi16_rpl(vNH, H_pr[-1], 15);
        vWH = _mm256_srli_si256_rpl(vWH, 2);
        vWH = _mm256_insert_epi16_rpl(vWH, s1_beg ? 0 : (-open - i*gap), 15);
        H_pr[-1] = -open - (i+N)*gap;
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m256i vMat;
            __m256i vNWH = vNH;
            vNH = _mm256_srli_si256_rpl(vWH, 2);
            vNH = _mm256_insert_epi16_rpl(vNH, H_pr[j], 15);
            vF = _mm256_srli_si256_rpl(vF, 2);
            vF = _mm256_insert_epi16_rpl(vF, F_pr[j], 15);
            vF = _mm256_max_epi16(
                    _mm256_subs_epi16(vNH, vOpen),
                    _mm256_subs_epi16(vF, vGap));
            vE = _mm256_max_epi16(
                    _mm256_subs_epi16(vWH, vOpen),
                    _mm256_subs_epi16(vE, vGap));
            vMat = _mm256_set_epi16(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]],
                    matrow2[s2[j-2]],
                    matrow3[s2[j-3]],
                    matrow4[s2[j-4]],
                    matrow5[s2[j-5]],
                    matrow6[s2[j-6]],
                    matrow7[s2[j-7]],
                    matrow8[s2[j-8]],
                    matrow9[s2[j-9]],
                    matrow10[s2[j-10]],
                    matrow11[s2[j-11]],
                    matrow12[s2[j-12]],
                    matrow13[s2[j-13]],
                    matrow14[s2[j-14]],
                    matrow15[s2[j-15]]
                    );
            vNWH = _mm256_adds_epi16(vNWH, vMat);
            vWH = _mm256_max_epi16(vNWH, vE);
            vWH = _mm256_max_epi16(vWH, vF);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m256i cond = _mm256_cmpeq_epi16(vJ,vNegOne);
                vWH = _mm256_blendv_epi8(vWH, vIBoundary, cond);
                vF = _mm256_blendv_epi8(vF, vNegInf, cond);
                vE = _mm256_blendv_epi8(vE, vNegInf, cond);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm256_min_epi16(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm256_max_epi16(vSaturationCheckMax, vWH);
            }
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vWH, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->rowcols->score_row, result->rowcols->score_col, vWH, i, s1Len, j, s2Len);
#endif
            H_pr[j-15] = (int16_t)_mm256_extract_epi16_rpl(vWH,0);
            F_pr[j-15] = (int16_t)_mm256_extract_epi16_rpl(vF,0);
            /* as minor diagonal vector passes across the i or j limit
             * boundary, extract the last value of the column or row */
            {
                __m256i vJeqLimit1 = _mm256_cmpeq_epi16(vJ, vJLimit1);
                __m256i vJgtNegOne = _mm256_cmpgt_epi16(vJ, vNegOne);
                __m256i vJltLimit = _mm256_cmplt_epi16_rpl(vJ, vJLimit);
                __m256i cond_j = _mm256_and_si256(vIltLimit, vJeqLimit1);
                __m256i cond_i = _mm256_and_si256(vIeqLimit1,
                        _mm256_and_si256(vJgtNegOne, vJltLimit));
                __m256i cond_max_row = _mm256_cmpgt_epi16(vWH, vMaxHRow);
                __m256i cond_max_col = _mm256_cmpgt_epi16(vWH, vMaxHCol);
                __m256i cond_last_val = _mm256_and_si256(vIeqLimit1, vJeqLimit1);
                __m256i cond_all_row = _mm256_and_si256(cond_max_row, cond_i);
                __m256i cond_all_col = _mm256_and_si256(cond_max_col, cond_j);
                vMaxHRow = _mm256_blendv_epi8(vMaxHRow, vWH, cond_all_row);
                vMaxHCol = _mm256_blendv_epi8(vMaxHCol, vWH, cond_all_col);
                vLastVal = _mm256_blendv_epi8(vLastVal, vWH, cond_last_val);
                vEndI = _mm256_blendv_epi8(vEndI, vI, cond_all_col);
                vEndJ = _mm256_blendv_epi8(vEndJ, vJ, cond_all_row);
            }
            vJ = _mm256_adds_epi16(vJ, vOne);
        }
        vI = _mm256_adds_epi16(vI, vN);
        vIBoundary = _mm256_subs_epi16(vIBoundary, vGapN);
    }

    /* alignment ending position */
    {
        int16_t max_row = NEG_LIMIT;
        int16_t max_col = NEG_LIMIT;
        int16_t last_val = NEG_LIMIT;
        int16_t *s = (int16_t*)&vMaxHRow;
        int16_t *t = (int16_t*)&vMaxHCol;
        int16_t *u = (int16_t*)&vLastVal;
        int16_t *i = (int16_t*)&vEndI;
        int16_t *j = (int16_t*)&vEndJ;
        int32_t k;
        for (k=0; k<N; ++k, ++s, ++t, ++u, ++i, ++j) {
            if (*t > max_col || (*t == max_col && *i < end_query)) {
                max_col = *t;
                end_query = *i;
            }
            if (*s > max_row) {
                max_row = *s;
                end_ref = *j;
            }
            if (*u > last_val) {
                last_val = *u;
            }
        }
        if (s1_end && s2_end) {
            if (max_col > max_row || (max_col == max_row && end_ref == s2Len-1)) {
                score = max_col;
                end_ref = s2Len-1;
            }
            else {
                score = max_row;
                end_query = s1Len-1;
            }
        }
        else if (s1_end) {
            score = max_col;
            end_ref = s2Len-1;
        }
        else if (s2_end) {
            score = max_row;
            end_query = s1Len-1;
        }
        else {
            score = last_val;
            end_query = s1Len-1;
            end_ref = s2Len-1;
        }
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi16_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(_F_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}